

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_dd81ad::MiniScriptTest::Test
          (MiniScriptTest *this,string *ms,string *hexscript,int mode,KeyConverter *converter,
          int opslimit,int stacklimit,optional<unsigned_int> max_wit_size,
          optional<unsigned_int> stack_exec)

{
  undefined1 *puVar1;
  undefined4 *puVar2;
  key_type *__k;
  undefined4 uVar3;
  MiniscriptContext MVar4;
  undefined **ppuVar5;
  _func_int *p_Var6;
  _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *p_Var7;
  _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *p_Var8;
  long lVar9;
  element_type *peVar10;
  bool bVar11;
  readonly_property65 rVar12;
  bool bVar13;
  int iVar14;
  Availability AVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  result_type_conflict rVar20;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  ulong uVar21;
  char *pcVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  bool *__args_2;
  _func_int *p_Var25;
  uint uVar26;
  undefined4 *puVar27;
  FastRandomContext *__urng;
  undefined1 *puVar28;
  _Link_type __x;
  int *piVar29;
  pointer pcVar30;
  KeyConverter *pKVar31;
  iterator pvVar32;
  _Alloc_node *__node_gen;
  BaseSignatureChecker *pBVar33;
  undefined4 in_register_0000008c;
  iterator pvVar34;
  ScriptError *pSVar35;
  ulong uVar36;
  int iVar37;
  byte bVar38;
  long lVar39;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  Span<const_unsigned_char> script_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar40;
  Span<const_char> in;
  NodeRef<typename_KeyConverter::Key> inferred_miniscript;
  NodeRef<typename_KeyConverter::Key> node;
  bool nonmal_success;
  bool satisfiable;
  bool mal_success;
  CScriptWitness witness_mal;
  bool prev_nonmal_success;
  bool prev_mal_success;
  TestSignatureChecker checker;
  ScriptError serror;
  CScript computed_script;
  CScript script_pubkey;
  __distr_type __d;
  Satisfier satisfier;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  challenges;
  CScript script;
  vector<int,_std::allocator<int>_> results;
  char *in_stack_fffffffffffff810;
  void *local_7d0;
  uint local_788;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  Node<CPubKey> *local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  NodeRef local_488;
  undefined1 local_474 [28];
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  byte local_289;
  CScriptWitness local_288;
  byte local_269;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  BaseSignatureChecker local_248;
  undefined1 *local_240;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  element_type *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_208;
  direct_or_indirect local_1f8;
  uint local_1dc;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  undefined1 local_1b8 [16];
  undefined1 auStack_1a8 [16];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_188;
  uchar auStack_178 [72];
  undefined1 local_130 [8];
  element_type *local_128;
  undefined1 auStack_120 [16];
  _Base_ptr local_110;
  _Base_ptr local_108;
  size_t local_100;
  undefined1 local_f8 [8];
  element_type *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_e8 [2];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [3];
  __index_type local_60;
  undefined1 local_58 [32];
  __aligned_membuf<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_> local_38;
  
  pvVar32 = (iterator)CONCAT44(in_register_0000008c,opslimit);
  local_38._M_storage = *(uchar (*) [8])(in_FS_OFFSET + 0x28);
  in.m_size = (size_t)(ms->_M_dataplus)._M_p;
  in.m_data = (char *)&local_488;
  pKVar31 = converter;
  local_474._0_4_ = opslimit;
  miniscript::internal::Parse<CPubKey,(anonymous_namespace)::KeyConverter>
            (in,(KeyConverter *)ms->_M_string_length);
  if (converter->m_script_ctx == P2WSH) {
    bVar38 = 0;
  }
  else {
    if (converter->m_script_ctx != TAPSCRIPT) {
LAB_004814bd:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    bVar38 = 1;
  }
  if (((mode == 0) || ((byte)((byte)mode >> 4 & (bVar38 ^ 1)) != 0)) ||
     ((mode & 0x20U) != 0 && (bVar38 ^ 1) == 0)) {
    local_498 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_490 = "";
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1c8;
    file.m_begin = (iterator)&local_498;
    msg.m_end = pvVar32;
    msg.m_begin = (iterator)pKVar31;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4a8,msg);
    if (local_488.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (Node<CPubKey> *)0x0) {
      bVar11 = true;
    }
    else {
      bVar11 = miniscript::Node<CPubKey>::IsValid
                         (local_488.
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      bVar11 = !bVar11;
    }
    local_130[0] = bVar11;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (assertion_result *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Unexpectedly valid: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_4b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4b0 = "";
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_4b8,0x1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
  }
  else {
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1ca;
    file_00.m_begin = (iterator)&local_4c8;
    msg_00.m_end = pvVar32;
    msg_00.m_begin = (iterator)pKVar31;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d8,
               msg_00);
    peVar10 = local_488.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_130[0] = local_488.
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != (Node<CPubKey> *)0x0;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Unparseable: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4e0 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_4e8,0x1ca);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    local_4f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4f0 = "";
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    local_500 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x1cb;
    file_01.m_begin = (iterator)&local_4f8;
    msg_01.m_end = pvVar34;
    msg_01.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_508,
               msg_01);
    rVar12.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)miniscript::Node<CPubKey>::IsValid(peVar10);
    local_130[0] = rVar12.super_readonly_property<bool>.super_class_property<bool>.value;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Invalid: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_510 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_518,0x1cb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    local_528 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_520 = "";
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    local_530 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x1cc;
    file_02.m_begin = (iterator)&local_528;
    msg_02.m_end = pvVar34;
    msg_02.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_538,
               msg_02);
    peVar10 = local_488.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    bVar11 = miniscript::Node<CPubKey>::IsValid
                       (local_488.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    local_130[0] = (byte)(peVar10->typ).m_flags & bVar11;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Invalid top level: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_548 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_540 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_548,0x1cc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)&local_1f8.indirect_contents,peVar10,converter);
    local_558 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_550 = "";
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    local_560 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x1ce;
    file_03.m_begin = (iterator)&local_558;
    msg_03.m_end = pvVar34;
    msg_03.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
               msg_03);
    uVar26 = local_1dc - 0x1d;
    if (local_1dc < 0x1d) {
      uVar26 = local_1dc;
    }
    local_130[0] = peVar10->scriptlen == (ulong)uVar26;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Script size mismatch: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_578 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_570 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_578,0x1ce);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    iVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(hexscript,"?");
    if (iVar14 != 0) {
      local_588 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_580 = "";
      local_598 = &boost::unit_test::basic_cstring<char_const>::null;
      local_590 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x1cf;
      file_04.m_begin = (iterator)&local_588;
      msg_04.m_end = pvVar34;
      msg_04.m_begin = pvVar32;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_598,
                 msg_04);
      uVar26 = local_1dc - 0x1d;
      uVar18 = local_1f8.indirect_contents.indirect;
      if (local_1dc < 0x1d) {
        uVar26 = local_1dc;
        uVar18 = &local_1f8;
      }
      s.m_size._0_4_ = uVar26;
      s.m_data = (uchar *)uVar18;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)local_198,s);
      if (local_198._8_8_ == hexscript->_M_string_length) {
        if (local_198._8_8_ == 0) {
          bVar11 = true;
        }
        else {
          iVar14 = bcmp((void *)local_198._0_8_,(hexscript->_M_dataplus)._M_p,local_198._8_8_);
          bVar11 = iVar14 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      local_268[0] = bVar11;
      local_268._8_8_ = (element_type *)0x0;
      aStack_258._M_allocated_capacity = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "Script mismatch: ",ms);
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8," (");
      local_1b8._0_8_ = (pbVar16->_M_dataplus)._M_p;
      paVar23 = &pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ == paVar23) {
        auStack_1a8._0_8_ = paVar23->_M_allocated_capacity;
        auStack_1a8._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_1b8._0_8_ = auStack_1a8;
      }
      else {
        auStack_1a8._0_8_ = paVar23->_M_allocated_capacity;
      }
      local_1b8._8_8_ = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar23;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      uVar26 = local_1dc - 0x1d;
      uVar18 = local_1f8.indirect_contents.indirect;
      if (local_1dc < 0x1d) {
        uVar26 = local_1dc;
        uVar18 = &local_1f8;
      }
      s_00.m_size._0_4_ = uVar26;
      s_00.m_data = (uchar *)uVar18;
      s_00.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)&local_218,s_00);
      puVar1 = (undefined1 *)
               ((long)&(local_210->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream + local_1b8._8_8_);
      puVar28 = (undefined1 *)0xf;
      if ((undefined1 *)local_1b8._0_8_ != auStack_1a8) {
        puVar28 = (undefined1 *)auStack_1a8._0_8_;
      }
      if (puVar28 < puVar1) {
        uVar18 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &aStack_208) {
          uVar18 = aStack_208._M_allocated_capacity;
        }
        if ((ulong)uVar18 < puVar1) goto LAB_0047e8ee;
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_218,0,0,(char *)local_1b8._0_8_,local_1b8._8_8_);
      }
      else {
LAB_0047e8ee:
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b8,local_218._M_p,(size_type)local_210);
      }
      local_c8._0_8_ = local_c8 + 0x10;
      ppuVar5 = (undefined **)(pbVar16->_M_dataplus)._M_p;
      paVar23 = &pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppuVar5 == paVar23) {
        local_b8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_b8._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
      }
      else {
        local_b8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_c8._0_8_ = ppuVar5;
      }
      local_c8._8_8_ = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar23;
      pbVar16->_M_string_length = 0;
      paVar23->_M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ," vs ");
      local_58._0_8_ = (pbVar16->_M_dataplus)._M_p;
      paVar23 = &pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ == paVar23) {
        local_58._16_8_ = paVar23->_M_allocated_capacity;
        local_58._24_8_ = *(long *)((long)&pbVar16->field_2 + 8);
        local_58._0_8_ = local_58 + 0x10;
      }
      else {
        local_58._16_8_ = paVar23->_M_allocated_capacity;
      }
      local_58._8_8_ = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar23;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(hexscript->_M_dataplus)._M_p,hexscript->_M_string_length);
      local_f8 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
      paVar23 = &pbVar16->field_2;
      if (local_f8 == (undefined1  [8])paVar23) {
        aaStack_e8[0]._0_8_ = paVar23->_M_allocated_capacity;
        aaStack_e8[0]._8_8_ = *(long *)((long)&pbVar16->field_2 + 8);
        local_f8 = (undefined1  [8])aaStack_e8;
      }
      else {
        aaStack_e8[0]._0_8_ = paVar23->_M_allocated_capacity;
      }
      local_f0 = (element_type *)pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar23;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,")");
      local_130 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
      paVar23 = &pbVar16->field_2;
      if (local_130 == (undefined1  [8])paVar23) {
        auStack_120._0_8_ = paVar23->_M_allocated_capacity;
        auStack_120._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_130 = (undefined1  [8])auStack_120;
      }
      else {
        auStack_120._0_8_ = paVar23->_M_allocated_capacity;
      }
      local_128 = (element_type *)pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar23;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013aba30;
      local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
      local_98[0]._8_8_ = local_130;
      local_5a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_5a0 = "";
      pvVar32 = (iterator)0x1;
      pvVar34 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_268,(lazy_ostream *)local_a8,1,1,WARN,
                 (check_type)in_stack_fffffffffffff810,(size_t)&local_5a8,0x1cf);
      if (local_130 != (undefined1  [8])auStack_120) {
        operator_delete((void *)local_130,(ulong)(auStack_120._0_8_ + 1));
      }
      if (local_f8 != (undefined1  [8])aaStack_e8) {
        operator_delete((void *)local_f8,(ulong)(aaStack_e8[0]._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != &aStack_208) {
        operator_delete(local_218._M_p,(ulong)(aStack_208._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_1b8._0_8_ != auStack_1a8) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(auStack_1a8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &aStack_1c8) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(aStack_1c8._M_allocated_capacity + 1));
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_268 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != &aStack_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(aStack_188._M_allocated_capacity + 1));
      }
    }
    local_5b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5b0 = "";
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x1d0;
    file_05.m_begin = (iterator)&local_5b8;
    msg_05.m_end = pvVar34;
    msg_05.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5c8,
               msg_05);
    peVar10 = local_488.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_130[0] = (mode & 2U) == 0 ^
                   (byte)(((local_488.
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->typ).m_flags >> 0xc) & 1;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Malleability mismatch: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_5d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5d0 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_5d8,0x1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x1d1;
    file_06.m_begin = (iterator)&local_5e8;
    msg_06.m_end = pvVar34;
    msg_06.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5f8,
               msg_06);
    local_130[0] = (mode & 4U) == 0 ^ (byte)((peVar10->typ).m_flags >> 0xb) & 1;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Signature necessity mismatch: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_600 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_608,0x1d1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    local_618 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_610 = "";
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x1d2;
    file_07.m_begin = (iterator)&local_618;
    msg_07.m_end = pvVar34;
    msg_07.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_628,
               msg_07);
    local_130[0] = (byte)((mode & 8U) >> 3) ^
                   (byte)(((local_488.
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->typ).m_flags >> 0x12) & 1;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Timelock mix mismatch: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_630 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_638,0x1d2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((miniscript *)&local_648,(CScript *)&local_1f8.indirect_contents,converter);
    local_658 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x1d4;
    file_08.m_begin = (iterator)&local_658;
    msg_08.m_end = pvVar34;
    msg_08.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_668,
               msg_08);
    local_130[0] = local_648 != (Node<CPubKey> *)0x0;
    local_128 = (element_type *)0x0;
    auStack_120._0_8_ = (assertion_result *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Cannot infer miniscript from script: ",ms);
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_198._0_8_ = &PTR__lazy_ostream_013aba30;
    aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_678 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_670 = "";
    pvVar32 = (iterator)0x1;
    pvVar34 = (iterator)0x1;
    aStack_188._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
    ;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_130,(lazy_ostream *)local_198,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_678,0x1d4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98[0]._M_allocated_capacity + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)auStack_120);
    local_688 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_680 = "";
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x1d5;
    file_09.m_begin = (iterator)&local_688;
    msg_09.m_end = pvVar34;
    msg_09.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_698,
               msg_09);
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)local_198,local_648,converter);
    bVar11 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_198,
                        (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        &local_1f8.indirect_contents);
    local_f8[0] = bVar11;
    local_f0 = (element_type *)0x0;
    aaStack_e8[0]._M_allocated_capacity =
         (_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   "Roundtrip failure: miniscript->script != miniscript->script->miniscript->script: "
                   ,ms);
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8._0_8_ = &PTR__lazy_ostream_013aba30;
    local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
    local_6a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_6a0 = "";
    __node_gen = (_Alloc_node *)0x1;
    pvVar32 = (iterator)0x1;
    local_98[0]._8_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f8,(lazy_ostream *)local_a8,1,1,WARN,
               (check_type)in_stack_fffffffffffff810,(size_t)&local_6a8,0x1d5);
    if (local_130 != (undefined1  [8])auStack_120) {
      operator_delete((void *)local_130,(ulong)(auStack_120._0_8_ + 1));
    }
    boost::detail::shared_count::~shared_count((shared_count *)&aaStack_e8[0]._M_allocated_capacity)
    ;
    if (0x1c < (uint)aStack_188._12_4_) {
      free((void *)local_198._0_8_);
      local_198._0_8_ = (_func_int **)0x0;
    }
    if (local_474._0_4_ != -1) {
      local_6b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6b0 = "";
      local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x1d6;
      file_10.m_begin = (iterator)&local_6b8;
      msg_10.m_end = pvVar32;
      msg_10.m_begin = (iterator)__node_gen;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_6c8,
                 msg_10);
      uVar17 = (ulong)((local_488.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ops).sat.valid;
      uVar24 = (ulong)(((local_488.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->ops).sat.value +
                      ((local_488.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ops).count);
      if (uVar17 == 0) {
        uVar24 = 0;
      }
      local_218._M_p = (pointer)(uVar17 << 0x20 | uVar24);
      local_98[0]._8_8_ = local_474;
      local_1d8[0] = local_474._0_4_ == (int)uVar24;
      local_1d8._8_8_ = (element_type *)0x0;
      aStack_1c8._M_allocated_capacity = 0;
      local_b8._M_allocated_capacity = (size_type)local_1b8;
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
      local_1b8._0_8_ = &PTR__lazy_ostream_013adba8;
      auStack_1a8._0_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_1a8._8_8_ = "Ops limit mismatch: ";
      local_58._16_8_ = local_c8;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
      local_c8._0_8_ = &PTR__lazy_ostream_013adb68;
      aaStack_e8[0]._0_8_ = local_58;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013adb28;
      local_58._24_8_ = (long)"\" (" + 1;
      aaStack_e8[0]._8_8_ = &local_218;
      local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
      local_f8 = (undefined1  [8])&PTR__lazy_ostream_013adae8;
      local_128 = (element_type *)((ulong)local_128 & 0xffffffffffffff00);
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013adaa8;
      auStack_120._8_8_ = " vs ";
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013ada68;
      local_98[0]._0_8_ = local_130;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_013ada28;
      aStack_188._8_8_ = (long)"((arith_uint256(Tmp64) ^ (OneL << i) ) != Tmp64 )" + 0x30;
      local_6d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6d0 = "";
      __node_gen = (_Alloc_node *)0x1;
      pvVar32 = (iterator)0x1;
      aStack_188._M_allocated_capacity = (size_type)(lazy_ostream *)local_a8;
      auStack_120._0_8_ = (assertion_result *)local_f8;
      local_b8._8_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d8,(lazy_ostream *)local_198,1,1,WARN,
                 (check_type)in_stack_fffffffffffff810,(size_t)&local_6d8,0x1d6);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_1c8._M_allocated_capacity);
    }
    if (stacklimit != -1) {
      local_6e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6e0 = "";
      local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x1d7;
      file_11.m_begin = (iterator)&local_6e8;
      msg_11.m_end = pvVar32;
      msg_11.m_begin = (iterator)__node_gen;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_6f8,
                 msg_11);
      bVar11 = ((local_488.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ss).sat.valid;
      iVar14 = 0;
      if (bVar11 == true) {
        iVar14 = (((local_488.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->ss).sat.netdiff + 1) -
                 (uint)((((local_488.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->typ).m_flags & 0xd) == 0);
      }
      local_1d8[0] = iVar14 == stacklimit;
      local_1d8._8_8_ = (element_type *)0x0;
      aStack_1c8._M_allocated_capacity = 0;
      uVar24 = 0;
      local_b8._M_allocated_capacity = (size_type)local_1b8;
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
      local_1b8._0_8_ = &PTR__lazy_ostream_013add68;
      auStack_1a8._0_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_1a8._8_8_ = "Stack limit mismatch: ";
      local_58._16_8_ = local_c8;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
      local_c8._0_8_ = &PTR__lazy_ostream_013add28;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013adce8;
      local_58._24_8_ = (long)"\" (" + 1;
      if (bVar11 == false) {
        uVar17 = 0;
      }
      else {
        uVar24 = (ulong)((((local_488.
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->ss).sat.netdiff + 1) -
                        (uint)((((local_488.
                                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->typ).m_flags & 0xd) == 0));
        uVar17 = 0x100000000;
      }
      local_218._M_p = (pointer)(uVar24 | uVar17);
      aaStack_e8[0]._8_8_ = &local_218;
      local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
      local_f8 = (undefined1  [8])&PTR__lazy_ostream_013adca8;
      aaStack_e8[0]._0_8_ = local_58;
      local_128 = (element_type *)((ulong)local_128 & 0xffffffffffffff00);
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013adc68;
      auStack_120._8_8_ = " vs ";
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013adc28;
      local_98[0]._0_8_ = local_130;
      local_98[0]._8_8_ = &stacklimit;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_013adbe8;
      aStack_188._8_8_ = (long)"((arith_uint256(Tmp64) ^ (OneL << i) ) != Tmp64 )" + 0x30;
      local_708 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_700 = "";
      __node_gen = (_Alloc_node *)0x1;
      pvVar32 = (iterator)0x1;
      aStack_188._M_allocated_capacity = (size_type)(lazy_ostream *)local_a8;
      auStack_120._0_8_ = (assertion_result *)local_f8;
      local_b8._8_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d8,(lazy_ostream *)local_198,1,1,WARN,
                 (check_type)in_stack_fffffffffffff810,(size_t)&local_708,0x1d7);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_1c8._M_allocated_capacity);
    }
    if (max_wit_size.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      local_718 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_710 = "";
      local_728 = &boost::unit_test::basic_cstring<char_const>::null;
      local_720 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x1d8;
      file_12.m_begin = (iterator)&local_718;
      msg_12.m_end = pvVar32;
      msg_12.m_begin = (iterator)__node_gen;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_728,
                 msg_12);
      uVar17 = (ulong)((local_488.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ws).sat.valid;
      uVar24 = (ulong)((local_488.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ws).sat.value;
      if (uVar17 == 0) {
        uVar24 = 0;
      }
      local_218._M_p = (pointer)(uVar17 << 0x20 | uVar24);
      local_98[0]._8_8_ = &max_wit_size;
      local_1d8[0] = max_wit_size.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload._M_value == (uint)uVar24;
      local_1d8._8_8_ = (element_type *)0x0;
      aStack_1c8._M_allocated_capacity = 0;
      local_b8._M_allocated_capacity = (size_type)local_1b8;
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
      local_1b8._0_8_ = &PTR__lazy_ostream_013acaa0;
      auStack_1a8._0_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_1a8._8_8_ = "Witness size limit mismatch: ";
      local_58._16_8_ = local_c8;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
      local_c8._0_8_ = &PTR__lazy_ostream_013adee8;
      aaStack_e8[0]._0_8_ = local_58;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013adea8;
      local_58._24_8_ = (long)"\" (" + 1;
      aaStack_e8[0]._8_8_ = &local_218;
      local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
      local_f8 = (undefined1  [8])&PTR__lazy_ostream_013ade68;
      local_128 = (element_type *)((ulong)local_128 & 0xffffffffffffff00);
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013ade28;
      auStack_120._8_8_ = " vs ";
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013adde8;
      local_98[0]._0_8_ = local_130;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_013adda8;
      aStack_188._8_8_ = (long)"((arith_uint256(Tmp64) ^ (OneL << i) ) != Tmp64 )" + 0x30;
      local_738 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_730 = "";
      __node_gen = (_Alloc_node *)0x1;
      pvVar32 = (iterator)0x1;
      aStack_188._M_allocated_capacity = (size_type)(lazy_ostream *)local_a8;
      auStack_120._0_8_ = (assertion_result *)local_f8;
      local_b8._8_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d8,(lazy_ostream *)local_198,1,1,WARN,
                 (check_type)in_stack_fffffffffffff810,(size_t)&local_738,0x1d8);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_1c8._M_allocated_capacity);
    }
    if (stack_exec.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      local_748 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_740 = "";
      local_758 = &boost::unit_test::basic_cstring<char_const>::null;
      local_750 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x1d9;
      file_13.m_begin = (iterator)&local_748;
      msg_13.m_end = pvVar32;
      msg_13.m_begin = (iterator)__node_gen;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_758,
                 msg_13);
      bVar11 = ((local_488.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ss).sat.valid;
      uVar26 = 0;
      if (bVar11 == true) {
        uVar26 = (((local_488.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->ss).sat.exec + 1) -
                 (uint)((((local_488.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->typ).m_flags & 0xd) == 0);
      }
      local_1d8[0] = uVar26 == stack_exec.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int>._M_payload._M_value;
      local_1d8._8_8_ = (element_type *)0x0;
      aStack_1c8._M_allocated_capacity = 0;
      uVar24 = 0;
      local_b8._M_allocated_capacity = (size_type)local_1b8;
      local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
      local_1b8._0_8_ = &PTR__lazy_ostream_013ae0a8;
      auStack_1a8._0_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_1a8._8_8_ = "Stack execution limit mismatch: ";
      local_58._16_8_ = local_c8;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
      local_c8._0_8_ = &PTR__lazy_ostream_013ae068;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013ae028;
      local_58._24_8_ = (long)"\" (" + 1;
      if (bVar11 == false) {
        uVar17 = 0;
      }
      else {
        uVar24 = (ulong)((((local_488.
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->ss).sat.exec + 1) -
                        (uint)((((local_488.
                                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->typ).m_flags & 0xd) == 0));
        uVar17 = 0x100000000;
      }
      local_98[0]._0_8_ = local_130;
      local_218._M_p = (pointer)(uVar24 | uVar17);
      aaStack_e8[0]._8_8_ = &local_218;
      local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
      local_f8 = (undefined1  [8])&PTR__lazy_ostream_013adfe8;
      aaStack_e8[0]._0_8_ = local_58;
      local_128 = (element_type *)((ulong)local_128 & 0xffffffffffffff00);
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013adfa8;
      auStack_120._8_8_ = " vs ";
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013adf68;
      local_98[0]._8_8_ = &stack_exec;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_013adf28;
      aStack_188._8_8_ = (long)"((arith_uint256(Tmp64) ^ (OneL << i) ) != Tmp64 )" + 0x30;
      local_768 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_760 = "";
      __node_gen = (_Alloc_node *)0x1;
      pvVar32 = (iterator)0x1;
      aStack_188._M_allocated_capacity = (size_type)(lazy_ostream *)local_a8;
      auStack_120._0_8_ = (assertion_result *)local_f8;
      local_b8._8_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1d8,(lazy_ostream *)local_198,1,1,WARN,
                 (check_type)in_stack_fffffffffffff810,(size_t)&local_768,0x1d9);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_1c8._M_allocated_capacity);
    }
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)local_c8,
               local_488.
               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,converter);
    FindChallenges((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                    *)local_f8,&local_488);
    uVar19 = aaStack_e8[0]._8_8_;
    uVar24 = 0;
    uVar18 = aaStack_e8[0]._8_8_;
    while ((_Rb_tree_node_base *)uVar18 != (_Rb_tree_node_base *)&local_f0) {
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
      uVar24 = uVar24 + 1;
    }
    if (uVar24 >> 0x3c != 0) {
      if (*(uchar (*) [8])(in_FS_OFFSET + 0x28) == local_38._M_storage) {
        uVar18 = std::__throw_length_error("cannot create std::vector larger than max_size()");
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&aStack_1c8._M_allocated_capacity);
        if (local_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640);
        }
        if (0x1c < local_1dc) {
          free(local_1f8.indirect_contents.indirect);
          local_1f8.indirect_contents.indirect = (char *)0x0;
        }
        if (local_488.
            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_488.
                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (*(uchar (*) [8])(in_FS_OFFSET + 0x28) == local_38._M_storage) {
          _Unwind_Resume(uVar18);
        }
      }
      goto LAB_00481bc5;
    }
    if (uVar24 == 0) {
      local_7d0 = (void *)0x0;
    }
    else {
      local_7d0 = operator_new(uVar24 * 8);
    }
    uVar17 = 0;
    while ((_Rb_tree_node_base *)uVar19 != (_Rb_tree_node_base *)&local_f0) {
      *(undefined8 *)((long)local_7d0 + uVar17) = *(undefined8 *)(uVar19 + 0x20);
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
      uVar17 = uVar17 + 8;
    }
    puVar2 = (undefined4 *)((long)local_7d0 + uVar17);
    __urng = &(this->super_BasicTestingSetup).m_rng;
    iVar14 = 0;
    do {
      if (uVar17 != 0) {
        if (uVar17 < 0x7fffffff9) {
          puVar27 = (undefined4 *)((long)local_7d0 + 8);
          if ((uVar17 & 8) == 0) {
            local_198._0_8_ = (_func_int **)0x0;
            local_198._8_8_ = 1;
            rVar20 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)local_198,__urng,
                                (param_type *)local_198);
            uVar18 = *(undefined8 *)((long)local_7d0 + 8);
            *(undefined8 *)((long)local_7d0 + 8) = *(undefined8 *)((long)local_7d0 + rVar20 * 8);
            *(undefined8 *)((long)local_7d0 + rVar20 * 8) = uVar18;
            puVar27 = (undefined4 *)((long)local_7d0 + 0x10);
          }
          if (puVar27 != puVar2) {
            lVar39 = (long)puVar27 - (long)local_7d0;
            do {
              uVar36 = (lVar39 >> 3) + 2;
              local_198._8_8_ = ((lVar39 >> 3) + 1) * uVar36 - 1;
              local_198._0_8_ = (_func_int **)0x0;
              rVar20 = std::uniform_int_distribution<unsigned_long>::operator()
                                 ((uniform_int_distribution<unsigned_long> *)local_198,__urng,
                                  (param_type *)local_198);
              uVar21 = rVar20 / uVar36;
              uVar36 = rVar20 % uVar36;
              uVar3 = *puVar27;
              *puVar27 = *(undefined4 *)((long)local_7d0 + uVar21 * 8);
              *(undefined4 *)((long)local_7d0 + uVar21 * 8) = uVar3;
              uVar3 = puVar27[1];
              puVar27[1] = *(undefined4 *)((long)local_7d0 + uVar21 * 8 + 4);
              *(undefined4 *)((long)local_7d0 + uVar21 * 8 + 4) = uVar3;
              uVar3 = puVar27[2];
              puVar27[2] = *(undefined4 *)((long)local_7d0 + uVar36 * 8);
              *(undefined4 *)((long)local_7d0 + uVar36 * 8) = uVar3;
              uVar3 = puVar27[3];
              puVar27[3] = *(undefined4 *)((long)local_7d0 + uVar36 * 8 + 4);
              *(undefined4 *)((long)local_7d0 + uVar36 * 8 + 4) = uVar3;
              lVar39 = lVar39 + 0x10;
              puVar27 = puVar27 + 4;
            } while (puVar27 != puVar2);
          }
        }
        else {
          local_198._0_8_ = (_func_int **)0x0;
          local_198._8_8_ = 0xffffffffffffffff;
          lVar39 = 8;
          do {
            local_a8._8_8_ = lVar39 >> 3;
            local_a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            rVar20 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)local_198,__urng,
                                (param_type *)local_a8);
            uVar3 = *(undefined4 *)((long)local_7d0 + lVar39);
            *(undefined4 *)((long)local_7d0 + lVar39) =
                 *(undefined4 *)((long)local_7d0 + rVar20 * 8);
            *(undefined4 *)((long)local_7d0 + rVar20 * 8) = uVar3;
            uVar3 = *(undefined4 *)((long)local_7d0 + lVar39 + 4);
            *(undefined4 *)((long)local_7d0 + lVar39 + 4) =
                 *(undefined4 *)((long)local_7d0 + rVar20 * 8 + 4);
            *(undefined4 *)((long)local_7d0 + rVar20 * 8 + 4) = uVar3;
            lVar9 = lVar39 + 8;
            lVar39 = lVar39 + 8;
          } while ((undefined4 *)((long)local_7d0 + lVar9) != puVar2);
        }
      }
      local_130._0_4_ = converter->m_script_ctx;
      auStack_120._0_8_ = auStack_120._0_8_ & 0xffffffff00000000;
      __args_2 = (bool *)0x0;
      auStack_120._8_8_ =
           (_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
            *)0x0;
      local_110 = (_Base_ptr)auStack_120;
      local_100 = 0;
      local_248._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_013ae0e8;
      local_240 = local_130;
      aStack_258._M_local_buf[0xf] = 0;
      aStack_258._M_local_buf[0xe] = 0;
      local_788 = (uint)(uVar17 >> 3);
      local_108 = local_110;
      if (-1 < (int)local_788) {
        uVar26 = 0xffffffff;
        do {
          __args_2 = (bool *)(ulong)uVar26;
          if (-1 < (int)uVar26) {
            __k = (key_type *)((long)local_7d0 + (long)__args_2 * 8);
            pVar40 = std::
                     _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                                 *)&local_128,__k);
            if (pVar40.second != (_Base_ptr)0x0) {
              std::
              _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
              ::
              _M_insert_<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>const&,std::_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>::_Alloc_node>
                        ((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                          *)&local_128,pVar40.first,pVar40.second,__k,__node_gen);
            }
          }
          local_198[0] = 1;
          auStack_178[0x28] = '\0';
          auStack_178[0x29] = '\0';
          auStack_178[0x2a] = '\0';
          auStack_178[0x2b] = '\0';
          auStack_178[0x2c] = '\0';
          auStack_178[0x2d] = '\0';
          auStack_178[0x2e] = '\0';
          auStack_178[0x2f] = '\0';
          auStack_178[0x30] = '\0';
          auStack_178[0x31] = '\0';
          auStack_178[0x32] = '\0';
          auStack_178[0x33] = '\0';
          auStack_178[0x34] = '\0';
          auStack_178[0x35] = '\0';
          auStack_178[0x36] = '\0';
          auStack_178[0x37] = '\0';
          auStack_178[0x18] = '\0';
          auStack_178[0x19] = '\0';
          auStack_178[0x1a] = '\0';
          auStack_178[0x1b] = '\0';
          auStack_178[0x1c] = '\0';
          auStack_178[0x1d] = '\0';
          auStack_178[0x1e] = '\0';
          auStack_178[0x1f] = '\0';
          auStack_178[0x20] = '\0';
          auStack_178[0x21] = '\0';
          auStack_178[0x22] = '\0';
          auStack_178[0x23] = '\0';
          auStack_178[0x24] = '\0';
          auStack_178[0x25] = '\0';
          auStack_178[0x26] = '\0';
          auStack_178[0x27] = '\0';
          auStack_178[8] = '\0';
          auStack_178[9] = '\0';
          auStack_178[10] = '\0';
          auStack_178[0xb] = '\0';
          auStack_178[0xc] = '\0';
          auStack_178[0xd] = '\0';
          auStack_178[0xe] = '\0';
          auStack_178[0xf] = '\0';
          auStack_178[0x10] = '\0';
          auStack_178[0x11] = '\0';
          auStack_178[0x12] = '\0';
          auStack_178[0x13] = '\0';
          auStack_178[0x14] = '\0';
          auStack_178[0x15] = '\0';
          auStack_178[0x16] = '\0';
          auStack_178[0x17] = '\0';
          aStack_188._8_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          auStack_178[0] = '\0';
          auStack_178[1] = '\0';
          auStack_178[2] = '\0';
          auStack_178[3] = '\0';
          auStack_178[4] = '\0';
          auStack_178[5] = '\0';
          auStack_178[6] = '\0';
          auStack_178[7] = '\0';
          local_198._8_8_ = 0;
          aStack_188._M_allocated_capacity = 0;
          auStack_178[0x38] = '\0';
          auStack_178[0x39] = '\0';
          auStack_178[0x3a] = '\0';
          auStack_178[0x3b] = '\0';
          auStack_178[0x3c] = '\0';
          auStack_178[0x3d] = '\0';
          auStack_178[0x3e] = '\0';
          auStack_178[0x3f] = '\0';
          if (converter->m_script_ctx == P2WSH) {
            local_98[0]._M_allocated_capacity = (undefined1 *)0x0;
            local_98[0]._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_a8._0_8_ = (undefined **)0x0;
            local_a8._8_8_ = 0;
            local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
            prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                       (iterator)local_a8,(uchar *)local_58);
            WitnessV0ScriptHash::WitnessV0ScriptHash
                      ((WitnessV0ScriptHash *)local_58,(CScript *)local_c8);
            b._M_extent._M_extent_value = 0x20;
            b._M_ptr = local_58;
            other = &CScript::operator<<((CScript *)local_a8,b)->super_CScriptBase;
            prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1b8,other);
            if (0x1c < (uint)local_98[0]._12_4_) {
              free((void *)local_a8._0_8_);
              local_a8._0_8_ = (undefined **)0x0;
            }
          }
          else {
            if (converter->m_script_ctx != TAPSCRIPT) goto LAB_004814bd;
            uVar3 = local_b8._12_4_ - 0x1d;
            ppuVar5 = (undefined **)local_c8._0_8_;
            if ((uint)local_b8._12_4_ < 0x1d) {
              uVar3 = local_b8._12_4_;
              ppuVar5 = (undefined **)local_c8;
            }
            __node_gen = (_Alloc_node *)0xc0;
            pvVar32 = (iterator)0x1;
            script_00.m_size._0_4_ = uVar3;
            script_00.m_data = (uchar *)ppuVar5;
            script_00.m_size._4_4_ = 0;
            TaprootBuilder::Add((TaprootBuilder *)local_198,0,script_00,0xc0,true);
            TaprootBuilder::Finalize((TaprootBuilder *)local_198,&XOnlyPubKey::NUMS_H);
            TaprootBuilder::GetOutput((WitnessV1Taproot *)local_58,(TaprootBuilder *)local_198);
            local_98[0]._M_allocated_capacity = local_58._16_8_;
            local_98[0]._8_8_ = local_58._24_8_;
            local_a8._0_8_ = local_58._0_8_;
            local_a8._8_8_ = local_58._8_8_;
            local_60 = '\x06';
            GetScriptForDestination((CScript *)local_1b8,(CTxDestination *)local_a8);
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_a8);
          }
          peVar10 = local_488.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          local_268._0_8_ = (CScriptWitness *)0x0;
          local_268._8_8_ = (element_type *)0x0;
          aStack_258._M_allocated_capacity = 0;
          AVar15 = miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
                             (local_488.
                              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(Satisfier *)local_130,
                              (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_268,false);
          local_269 = AVar15 == YES;
          SatisfactionToWitness
                    (converter->m_script_ctx,(CScriptWitness *)local_268,(CScript *)local_c8,
                     (TaprootBuilder *)local_198);
          local_288.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
          local_288.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
          local_288.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          AVar15 = miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
                             (peVar10,(Satisfier *)local_130,&local_288.stack,true);
          local_289 = AVar15 == YES;
          local_a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          VectorFormatter<DefaultFormatter>::
          Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((VectorFormatter<DefaultFormatter> *)local_58,(SizeComputer *)local_a8,
                     &local_288.stack);
          uVar18 = local_a8._0_8_;
          uVar21 = ((long)local_288.stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar39 = -1;
          if ((0xfc < uVar21) && (lVar39 = -3, 0xffff < uVar21)) {
            lVar39 = (ulong)(uVar21 >> 0x20 == 0) * 4 + -9;
          }
          SatisfactionToWitness
                    (converter->m_script_ctx,&local_288,(CScript *)local_c8,
                     (TaprootBuilder *)local_198);
          if (local_289 == 1) {
            iVar37 = 1;
            if ((peVar10->ss).sat.valid == true) {
              iVar37 = ((peVar10->ss).sat.netdiff - (uint)(((peVar10->typ).m_flags & 0xd) == 0)) + 2
              ;
            }
            MVar4 = converter->m_script_ctx;
            if (TAPSCRIPT < MVar4) goto LAB_004814bd;
            local_2a0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_298 = "";
            local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_14.m_end = (iterator)0x17e;
            file_14.m_begin = (iterator)&local_2a0;
            msg_14.m_end = pvVar32;
            msg_14.m_begin = (iterator)__node_gen;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                       (size_t)&local_2b0,msg_14);
            uVar36 = (ulong)(MVar4 + iVar37);
            uVar21 = ((long)local_288.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = 0;
            local_1d8._0_8_ = "witness_nonmal.stack.size() <= max_stack_size";
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_2c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_2b8 = "";
            pvVar32 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            local_58[0] = (class_property<bool>)
                          (class_property<bool>)(uVar21 < uVar36 || uVar21 - uVar36 == 0);
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_2c0,0x17e);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
            local_2d0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_2c8 = "";
            local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_15.m_end = (iterator)0x180;
            file_15.m_begin = (iterator)&local_2d0;
            msg_15.m_end = pvVar34;
            msg_15.m_begin = pvVar32;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                       (size_t)&local_2e0,msg_15);
            local_58[0] = (class_property<bool>)(class_property<bool>)local_269;
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = 0;
            local_1d8._0_8_ = "mal_success";
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_2f0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_2e8 = "";
            pvVar32 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_2f0,0x180);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
            local_300 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_2f8 = "";
            local_310 = &boost::unit_test::basic_cstring<char_const>::null;
            local_308 = &boost::unit_test::basic_cstring<char_const>::null;
            file_16.m_end = (iterator)0x181;
            file_16.m_begin = (iterator)&local_300;
            msg_16.m_end = pvVar34;
            msg_16.m_begin = pvVar32;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                       (size_t)&local_310,msg_16);
            if ((long)local_288.stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_288.stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == local_268._8_8_ - local_268._0_8_
               ) {
              bVar11 = std::__equal<false>::
                       equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                                 (local_288.stack.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_288.stack.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  local_268._0_8_);
            }
            else {
              bVar11 = false;
            }
            local_58[0] = (class_property<bool>)(class_property<bool>)bVar11;
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = 0;
            local_1d8._0_8_ = "witness_nonmal.stack == witness_mal.stack";
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_320 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_318 = "";
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_320,0x181);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
            peVar10 = local_488.
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            pcVar22 = (char *)(ulong)((local_488.
                                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->ws).sat.value;
            if (((local_488.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->ws).sat.valid == false) {
              pcVar22 = (char *)0x0;
            }
            if (pcVar22 < (char *)(lVar39 + uVar18)) {
              __assert_fail("wit_size <= *node->GetWitnessSize()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                            ,0x182,
                            "void (anonymous namespace)::MiniScriptTest::TestSatisfy(const KeyConverter &, const std::string &, const NodeRef &)"
                           );
            }
            local_98[0]._M_allocated_capacity = (undefined1 *)0x0;
            local_98[0]._8_8_ = (undefined1 *)0x0;
            local_a8._0_8_ = (undefined **)0x0;
            local_a8._8_8_ = 0;
            pBVar33 = &local_248;
            pSVar35 = (ScriptError *)&local_218;
            bVar11 = VerifyScript((CScript *)local_a8,(CScript *)local_1b8,&local_288,0x1fffdf,
                                  pBVar33,pSVar35);
            if (0x1c < (uint)local_98[0]._12_4_) {
              free((void *)local_a8._0_8_);
              local_a8._0_8_ = (undefined **)0x0;
            }
            bVar13 = miniscript::Node<CPubKey>::ValidSatisfactions(peVar10);
            if (bVar13) {
              local_330 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
              ;
              local_328 = "";
              local_340 = &boost::unit_test::basic_cstring<char_const>::null;
              local_338 = &boost::unit_test::basic_cstring<char_const>::null;
              file_17.m_end = (iterator)0x188;
              file_17.m_begin = (iterator)&local_330;
              msg_17.m_end = (iterator)pSVar35;
              msg_17.m_begin = (iterator)pBVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                         (size_t)&local_340,msg_17);
              local_58[0] = (class_property<bool>)(class_property<bool>)bVar11;
              local_58._8_8_ = (element_type *)0x0;
              local_58._16_8_ = 0;
              local_1d8._0_8_ = "res";
              local_1d8._8_8_ = "";
              local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
              local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
              local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
              local_98[0]._8_8_ = local_1d8;
              local_350 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
              ;
              local_348 = "";
              pBVar33 = (BaseSignatureChecker *)0x1;
              pSVar35 = (ScriptError *)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                         (check_type)in_stack_fffffffffffff810,(size_t)&local_350,0x188);
              boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
            }
            local_360 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_358 = "";
            local_370 = &boost::unit_test::basic_cstring<char_const>::null;
            local_368 = &boost::unit_test::basic_cstring<char_const>::null;
            file_18.m_end = (iterator)0x18d;
            file_18.m_begin = (iterator)&local_360;
            msg_18.m_end = (iterator)pSVar35;
            msg_18.m_begin = (iterator)pBVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                       (size_t)&local_370,msg_18);
            bVar38 = 1;
            if (!bVar11) {
              bVar11 = miniscript::Node<CPubKey>::CheckOpsLimit(peVar10);
              if (bVar11 || (_Rb_tree_color)local_218._M_p != 6) {
                bVar11 = miniscript::Node<CPubKey>::CheckStackSize(peVar10);
                bVar38 = ~bVar11 & (_Rb_tree_color)local_218._M_p == 7;
              }
            }
            local_58[0] = (class_property<bool>)(class_property<bool>)bVar38;
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = (undefined1 *)0x0;
            local_1d8._0_8_ =
                 "res || (!node->CheckOpsLimit() && serror == ScriptError::SCRIPT_ERR_OP_COUNT) || (!node->CheckStackSize() && serror == ScriptError::SCRIPT_ERR_STACK_SIZE)"
            ;
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_380 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_378 = "";
            __node_gen = (_Alloc_node *)0x1;
            pvVar32 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_380,0x18d);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
          }
          if ((local_269 == 1) &&
             (((local_289 != 1 ||
               (local_268._8_8_ - local_268._0_8_ !=
                (long)local_288.stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_288.stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)) ||
              (bVar11 = std::__equal<false>::
                        equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_268._0_8_,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_268._8_8_,
                                   local_288.stack.
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start), !bVar11)))) {
            local_98[0]._M_allocated_capacity = 0;
            local_98[0]._8_8_ = 0;
            local_a8._0_8_ = (pointer)0x0;
            local_a8._8_8_ = 0;
            pBVar33 = &local_248;
            pSVar35 = (ScriptError *)&local_218;
            bVar11 = VerifyScript((CScript *)local_a8,(CScript *)local_1b8,
                                  (CScriptWitness *)local_268,0x1fffdf,pBVar33,pSVar35);
            if (0x1c < (uint)local_98[0]._12_4_) {
              free((void *)local_a8._0_8_);
              local_a8._0_8_ = (pointer)0x0;
            }
            local_390 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_388 = "";
            local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_398 = &boost::unit_test::basic_cstring<char_const>::null;
            file_19.m_end = (iterator)0x196;
            file_19.m_begin = (iterator)&local_390;
            msg_19.m_end = (iterator)pSVar35;
            msg_19.m_begin = (iterator)pBVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_3a0,msg_19);
            local_58[0] = (class_property<bool>)
                          (class_property<bool>)
                          (bVar11 || ((_Rb_tree_color)local_218._M_p & ~_S_black) == 6);
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = (undefined1 *)0x0;
            local_1d8._0_8_ =
                 "res || serror == ScriptError::SCRIPT_ERR_OP_COUNT || serror == ScriptError::SCRIPT_ERR_STACK_SIZE"
            ;
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_3b0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_3a8 = "";
            __node_gen = (_Alloc_node *)0x1;
            pvVar32 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_3b0,0x196);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
          }
          peVar10 = local_488.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          bVar11 = miniscript::Node<CPubKey>::IsSane
                             (local_488.
                              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          if (bVar11) {
            local_3c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_3b8 = "";
            local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_20.m_end = (iterator)0x19b;
            file_20.m_begin = (iterator)&local_3c0;
            msg_20.m_end = pvVar32;
            msg_20.m_begin = (iterator)__node_gen;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_3d0,msg_20);
            local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
            local_1d8._0_8_ = &PTR__lazy_ostream_013abb30;
            aStack_1c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            aStack_1c8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
            local_218._M_p._0_1_ = local_269 == local_289;
            local_210 = (element_type *)0x0;
            aStack_208._M_allocated_capacity = 0;
            local_228._M_allocated_capacity = 0xea4d7d;
            local_228._8_8_ =
                 (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                 + 0x69;
            local_238._8_8_ = &local_269;
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abe90;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_238 + 8;
            local_238._0_8_ = &local_289;
            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
            local_58._0_8_ = &PTR__lazy_ostream_013abe90;
            local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
            local_58._24_8_ = local_238;
            in_stack_fffffffffffff810 = "mal_success";
            __node_gen = (_Alloc_node *)0x1;
            pvVar32 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_218,(lazy_ostream *)local_1d8,1,2,REQUIRE,0xeaaafb
                       ,(size_t)&local_228,0x19b,local_a8,"nonmal_success",local_58);
            boost::detail::shared_count::~shared_count((shared_count *)&aStack_208);
          }
          local_3e0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_3d8 = "";
          local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_21.m_end = (iterator)0x19f;
          file_21.m_begin = (iterator)&local_3e0;
          msg_21.m_end = pvVar32;
          msg_21.m_begin = (iterator)__node_gen;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                     (size_t)&local_3f0,msg_21);
          local_58[0] = (class_property<bool>)
                        (class_property<bool>)((byte)aStack_258._M_local_buf[0xf] <= local_269);
          local_58._8_8_ = (element_type *)0x0;
          local_58._16_8_ = (undefined1 *)0x0;
          local_1d8._0_8_ = "mal_success >= prev_mal_success";
          local_1d8._8_8_ = "";
          local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
          local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
          local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
          local_98[0]._8_8_ = local_1d8;
          local_400 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_3f8 = "";
          __node_gen = (_Alloc_node *)0x1;
          pvVar32 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                     (check_type)in_stack_fffffffffffff810,(size_t)&local_400,0x19f);
          boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
          bVar11 = miniscript::Node<CPubKey>::IsSane(peVar10);
          if (((int)uVar26 < 0 || bVar11) || (*(int *)((long)local_7d0 + (long)__args_2 * 8) == 6))
          {
            local_410 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_408 = "";
            local_420 = &boost::unit_test::basic_cstring<char_const>::null;
            local_418 = &boost::unit_test::basic_cstring<char_const>::null;
            file_22.m_end = (iterator)0x1a4;
            file_22.m_begin = (iterator)&local_410;
            msg_22.m_end = pvVar32;
            msg_22.m_begin = (iterator)__node_gen;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_420,msg_22);
            local_58[0] = (class_property<bool>)
                          (class_property<bool>)((byte)aStack_258._M_local_buf[0xe] <= local_289);
            local_58._8_8_ = (element_type *)0x0;
            local_58._16_8_ = (undefined1 *)0x0;
            local_1d8._0_8_ = "nonmal_success >= prev_nonmal_success";
            local_1d8._8_8_ = "";
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
            local_a8._0_8_ = &PTR__lazy_ostream_013abc70;
            local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
            local_98[0]._8_8_ = local_1d8;
            local_430 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_428 = "";
            __node_gen = (_Alloc_node *)0x1;
            pvVar32 = (iterator)0x0;
            __args_2 = (bool *)0x1a4;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_58,(lazy_ostream *)local_a8,1,0,WARN,
                       (check_type)in_stack_fffffffffffff810,(size_t)&local_430,0x1a4);
            boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
          }
          aStack_258._M_local_buf[0xf] = local_269;
          aStack_258._M_local_buf[0xe] = local_289;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_288.stack);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)local_268);
          if (0x1c < (uint)auStack_1a8._12_4_) {
            free((void *)local_1b8._0_8_);
            local_1b8._0_8_ = (undefined **)0x0;
          }
          std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::~vector((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                     *)(local_198 + 8));
          uVar26 = uVar26 + 1;
        } while (local_788 != uVar26);
      }
      peVar10 = local_488.
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      aStack_188._M_allocated_capacity = 0;
      local_198._0_8_ = (_func_int **)0x0;
      local_198._8_8_ = (_func_int **)0x0;
      local_98[0]._M_allocated_capacity = (int *)0x0;
      local_a8._0_8_ = (int *)0x0;
      local_a8._8_8_ = (int *)0x0;
      local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
      std::
      vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1})const::{lambda(miniscript::Node<CPubKey>const&,Span<int>)#1}>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st...<int>)#1}>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)#1})const::StackElem>>
      ::
      emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_)const::DummyState>
                ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                  *)local_198,
                 local_488.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int *)local_58,__args_2);
      if (local_198._8_8_ != local_198._0_8_) {
        do {
          uVar18 = local_198._8_8_;
          __node_gen = *(_Alloc_node **)(local_198._8_8_ + -0x18);
          p_Var6 = *(_func_int **)(local_198._8_8_ + -0x10);
          p_Var7 = __node_gen[7]._M_t;
          p_Var8 = __node_gen[8]._M_t;
          p_Var25 = (_func_int *)((long)p_Var8 - (long)p_Var7 >> 4);
          if (p_Var6 < p_Var25) {
            *(_func_int **)(local_198._8_8_ + -0x10) = p_Var6 + 1;
            local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
            std::
            vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1})const::{lambda(miniscript::Node<CPubKey>const&,Span<int>)#1}>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st...<int>)#1}>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)#1})const::StackElem>>
            ::
            emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_)const::DummyState>
                      ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                        *)local_198,
                       *(Node<CPubKey> **)(&(p_Var7->_M_impl).field_0x0 + (long)p_Var6 * 0x10),
                       (int *)local_58,(bool *)(p_Var6 + 1));
          }
          else {
            if ((_func_int *)((long)(local_a8._8_8_ - local_a8._0_8_) >> 2) < p_Var25) {
              __assert_fail("results.size() >= node.subs.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                            ,0x273,
                            "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = int, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                           );
            }
            piVar29 = (int *)((pointer)(local_a8._0_8_ + (local_a8._8_8_ - local_a8._0_8_)) +
                             (long)p_Var25 * -4);
            pvVar32 = (iterator)0x0;
            switch(*(undefined4 *)&__node_gen->_M_t) {
            case 0:
              break;
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            case 0x19:
            case 0x1a:
              pvVar32 = (iterator)0x1;
              break;
            default:
              if ((long)p_Var8 - (long)p_Var7 != 0x10) {
                __assert_fail("subs.size() == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                              ,0x62f,
                              "auto miniscript::Node<CPubKey>::IsSatisfiable((lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp:427:48))::(anonymous class)::operator()(const Node<Key> &, Span<int>) const [Key = CPubKey]"
                             );
              }
              bVar11 = *piVar29 == 0;
LAB_00480fb8:
              pvVar32 = (iterator)(ulong)!bVar11;
              break;
            case 0x11:
            case 0x12:
              if (*piVar29 != 0) {
LAB_00480f68:
                bVar11 = piVar29[1] == 0;
                goto LAB_00480fb8;
              }
              pvVar32 = (iterator)0x0;
              break;
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
              pvVar32 = (iterator)0x1;
              if (*piVar29 == 0) goto LAB_00480f68;
              break;
            case 0x17:
              if ((*piVar29 == 0) || (pvVar32 = (iterator)0x1, piVar29[1] == 0)) {
                bVar11 = piVar29[2] == 0;
                goto LAB_00480fb8;
              }
              break;
            case 0x18:
              if (p_Var8 == p_Var7) {
                lVar39 = 0;
              }
              else {
                lVar39 = 0;
                do {
                  lVar39 = lVar39 + (ulong)(*piVar29 == 1);
                  piVar29 = piVar29 + 1;
                } while (piVar29 != (int *)local_a8._8_8_);
              }
              pvVar32 = (iterator)
                        CONCAT71((int7)((ulong)lVar39 >> 8),
                                 *(uint *)((long)&__node_gen->_M_t + 4) <= (uint)lVar39);
            }
            __node_gen = (_Alloc_node *)0x100000000;
            pcVar30 = (pointer)((ulong)pvVar32 & 0xff | 0x100000000);
            if (p_Var8 != p_Var7) {
              local_a8._8_8_ = local_a8._8_8_ + (long)p_Var25 * -4;
            }
            local_58._0_8_ = pcVar30;
            if (local_a8._8_8_ == local_98[0]._M_allocated_capacity) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_a8,(iterator)local_a8._8_8_,
                         (int *)local_58);
            }
            else {
              local_58._0_4_ = (undefined4)((ulong)pvVar32 & 0xff);
              *(undefined4 *)local_a8._8_8_ = local_58._0_4_;
              local_a8._8_8_ = local_a8._8_8_ + 4;
            }
            local_198._8_8_ = uVar18 + -0x18;
          }
        } while (local_198._8_8_ != local_198._0_8_);
      }
      if (local_a8._8_8_ - local_a8._0_8_ != 4) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x27e,
                      "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = int, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      iVar37 = *(int *)local_a8._0_8_;
      if ((int *)local_a8._0_8_ != (int *)0x0) {
        operator_delete((void *)local_a8._0_8_,local_98[0]._M_allocated_capacity - local_a8._0_8_);
      }
      if ((_func_int **)local_198._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_198._0_8_,aStack_188._M_allocated_capacity - local_198._0_8_);
      }
      local_288.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_288.stack.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar37 != 0);
      local_440 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_438 = "";
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      local_448 = &boost::unit_test::basic_cstring<char_const>::null;
      file_23.m_end = (iterator)0x1ad;
      file_23.m_begin = (iterator)&local_440;
      msg_23.m_end = pvVar32;
      msg_23.m_begin = (iterator)__node_gen;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_450,
                 msg_23);
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abb30;
      local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_58._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_1b8[0] = aStack_258._M_local_buf[0xf] ==
                     (byte)local_288.stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      local_1b8._8_8_ = 0;
      auStack_1a8._0_8_ = (undefined1 *)0x0;
      local_1d8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_1d8._8_8_ = "";
      local_218._M_p = local_268 + 0x1f;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_198._0_8_ = &PTR__lazy_ostream_013abe90;
      aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_188._8_8_ = &local_218;
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
      local_a8._0_8_ = &PTR__lazy_ostream_013abe90;
      local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
      local_98[0]._8_8_ = local_268;
      in_stack_fffffffffffff810 = "prev_mal_success";
      __x = (_Link_type)local_58;
      __node_gen = (_Alloc_node *)0x1;
      pvVar32 = (iterator)0x2;
      local_268._0_8_ = &local_288;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1b8,(lazy_ostream *)__x,1,2,REQUIRE,0xeaaaf6,
                 (size_t)local_1d8,0x1ad,
                 (vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                  *)local_198,"satisfiable",local_a8);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_1a8);
      bVar11 = miniscript::Node<CPubKey>::IsSane(peVar10);
      if (bVar11) {
        local_474._20_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_458 = "";
        local_474._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
        local_474._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
        file_24.m_end = (iterator)0x1af;
        file_24.m_begin = local_474 + 0x14;
        msg_24.m_end = pvVar32;
        msg_24.m_begin = (iterator)__node_gen;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                   (size_t)(local_474 + 4),msg_24);
        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
        local_58._0_8_ = &PTR__lazy_ostream_013abb30;
        local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
        local_58._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_1b8[0] = aStack_258._M_local_buf[0xe] ==
                       (byte)local_288.stack.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._8_8_ = 0;
        auStack_1a8._0_8_ = (undefined1 *)0x0;
        local_1d8._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_1d8._8_8_ = "";
        local_218._M_p = local_268 + 0x1e;
        local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
        local_198._0_8_ = &PTR__lazy_ostream_013abe90;
        aStack_188._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        aStack_188._8_8_ = &local_218;
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        local_a8._0_8_ = &PTR__lazy_ostream_013abe90;
        local_98[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
        local_98[0]._8_8_ = local_268;
        in_stack_fffffffffffff810 = "prev_nonmal_success";
        __x = (_Link_type)local_58;
        __node_gen = (_Alloc_node *)0x1;
        pvVar32 = (iterator)0x2;
        local_268._0_8_ = &local_288;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_1b8,(lazy_ostream *)__x,1,2,REQUIRE,0xeaab19,
                   (size_t)local_1d8,0x1af,
                   (vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                    *)local_198,"satisfiable",local_a8);
        boost::detail::shared_count::~shared_count((shared_count *)auStack_1a8);
      }
      std::
      _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ::_M_erase((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  *)auStack_120._8_8_,__x);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 3);
    if (local_7d0 != (void *)0x0) {
      __x = (_Link_type)(uVar24 << 3);
      operator_delete(local_7d0,(ulong)__x);
    }
    std::
    _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::_M_erase((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                *)aaStack_e8[0]._0_8_,__x);
    if (0x1c < (uint)local_b8._12_4_) {
      free((void *)local_c8._0_8_);
      local_c8._0_8_ = (undefined **)0x0;
    }
    if (local_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640);
    }
    if (0x1c < local_1dc) {
      free(local_1f8.indirect_contents.indirect);
      local_1f8.indirect_contents.indirect = (char *)0x0;
    }
  }
  if (local_488.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.
               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (*(uchar (*) [8])(in_FS_OFFSET + 0x28) == local_38._M_storage) {
    return;
  }
LAB_00481bc5:
  __stack_chk_fail();
}

Assistant:

void Test(const std::string& ms, const std::string& hexscript, int mode, const KeyConverter& converter,
          int opslimit = -1, int stacklimit = -1, std::optional<uint32_t> max_wit_size = std::nullopt,
          std::optional<uint32_t> stack_exec = {})
{
    auto node = miniscript::FromString(ms, converter);
    const bool is_tapscript{miniscript::IsTapscript(converter.MsContext())};
    if (mode == TESTMODE_INVALID || ((mode & TESTMODE_P2WSH_INVALID) && !is_tapscript) || ((mode & TESTMODE_TAPSCRIPT_INVALID) && is_tapscript)) {
        BOOST_CHECK_MESSAGE(!node || !node->IsValid(), "Unexpectedly valid: " + ms);
    } else {
        BOOST_CHECK_MESSAGE(node, "Unparseable: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValid(), "Invalid: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValidTopLevel(), "Invalid top level: " + ms);
        auto computed_script = node->ToScript(converter);
        BOOST_CHECK_MESSAGE(node->ScriptSize() == computed_script.size(), "Script size mismatch: " + ms);
        if (hexscript != "?") BOOST_CHECK_MESSAGE(HexStr(computed_script) == hexscript, "Script mismatch: " + ms + " (" + HexStr(computed_script) + " vs " + hexscript + ")");
        BOOST_CHECK_MESSAGE(node->IsNonMalleable() == !!(mode & TESTMODE_NONMAL), "Malleability mismatch: " + ms);
        BOOST_CHECK_MESSAGE(node->NeedsSignature() == !!(mode & TESTMODE_NEEDSIG), "Signature necessity mismatch: " + ms);
        BOOST_CHECK_MESSAGE((node->GetType() << "k"_mst) == !(mode & TESTMODE_TIMELOCKMIX), "Timelock mix mismatch: " + ms);
        auto inferred_miniscript = miniscript::FromScript(computed_script, converter);
        BOOST_CHECK_MESSAGE(inferred_miniscript, "Cannot infer miniscript from script: " + ms);
        BOOST_CHECK_MESSAGE(inferred_miniscript->ToScript(converter) == computed_script, "Roundtrip failure: miniscript->script != miniscript->script->miniscript->script: " + ms);
        if (opslimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetOps() == opslimit, "Ops limit mismatch: " << ms << " (" << *node->GetOps() << " vs " << opslimit << ")");
        if (stacklimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetStackSize() == stacklimit, "Stack limit mismatch: " << ms << " (" << *node->GetStackSize() << " vs " << stacklimit << ")");
        if (max_wit_size) BOOST_CHECK_MESSAGE(*node->GetWitnessSize() == *max_wit_size, "Witness size limit mismatch: " << ms << " (" << *node->GetWitnessSize() << " vs " << *max_wit_size << ")");
        if (stack_exec) BOOST_CHECK_MESSAGE(*node->GetExecStackSize() == *stack_exec, "Stack execution limit mismatch: " << ms << " (" << *node->GetExecStackSize() << " vs " << *stack_exec << ")");
        TestSatisfy(converter, ms, node);
    }
}